

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O1

XrResult ActiveLoaderInstance::Set
                   (unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_>
                    *loader_instance,char *log_function_name)

{
  unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> uVar1;
  long lVar2;
  XrResult XVar3;
  allocator local_69;
  string local_68;
  string local_48;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_28;
  
  anon_unknown.dwarf_61790::GetSetCurrentLoaderInstance();
  if ((__uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>)
      anon_unknown.dwarf_61790::GetSetCurrentLoaderInstance::current_loader_instance._M_t.
      super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
      super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
      super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>)0x0) {
    anon_unknown.dwarf_61790::GetSetCurrentLoaderInstance();
    uVar1 = (unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_>)
            (loader_instance->_M_t).
            super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
            super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
            super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl;
    (loader_instance->_M_t).
    super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
    super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
    super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl = (LoaderInstance *)0x0;
    XVar3 = XR_SUCCESS;
    if ((__uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>)
        anon_unknown.dwarf_61790::GetSetCurrentLoaderInstance::current_loader_instance._M_t.
        super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
        super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
        super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>)0x0) {
      lVar2 = *(long *)anon_unknown.dwarf_61790::GetSetCurrentLoaderInstance::
                       current_loader_instance._M_t.
                       super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>
                       .super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl;
      anon_unknown.dwarf_61790::GetSetCurrentLoaderInstance::current_loader_instance._M_t.
      super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
      super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
      super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl =
           uVar1._M_t.super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>.
           _M_t.super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
           super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl;
      (**(code **)(lVar2 + 8))();
      XVar3 = XR_SUCCESS;
      uVar1._M_t.super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
      super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
      super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl =
           anon_unknown.dwarf_61790::GetSetCurrentLoaderInstance::current_loader_instance._M_t.
           super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
           super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
           super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_48,log_function_name,&local_69);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Active XrInstance handle already exists","");
    local_28.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderLogger::LogErrorMessage(&local_48,&local_68,&local_28);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    XVar3 = XR_ERROR_LIMIT_REACHED;
    uVar1._M_t.super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
    super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
    super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl =
         anon_unknown.dwarf_61790::GetSetCurrentLoaderInstance::current_loader_instance._M_t.
         super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
         super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
         super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl;
  }
  anon_unknown.dwarf_61790::GetSetCurrentLoaderInstance::current_loader_instance._M_t.
  super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
  super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
  super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl =
       uVar1._M_t.super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
       super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
       super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl;
  return XVar3;
}

Assistant:

XrResult Set(std::unique_ptr<LoaderInstance> loader_instance, const char* log_function_name) {
    if (GetSetCurrentLoaderInstance() != nullptr) {
        LoaderLogger::LogErrorMessage(log_function_name, "Active XrInstance handle already exists");
        return XR_ERROR_LIMIT_REACHED;
    }

    GetSetCurrentLoaderInstance() = std::move(loader_instance);
    return XR_SUCCESS;
}